

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O2

void __thiscall Minisat::Clause::strengthen(Clause *this,Lit p)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = (uint)this->header >> 5;
  uVar3 = 0;
  while( true ) {
    if (uVar1 == uVar3) {
      __assert_fail("j < (int)ts.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Alg.h"
                    ,0x28,
                    "void Minisat::remove(V &, const T &) [V = Minisat::Clause, T = Minisat::Lit]");
    }
    if (this[uVar3 + 1].header == (anon_struct_4_5_613047fb_for_header)p.x) break;
    uVar3 = uVar3 + 1;
  }
  uVar1 = uVar1 - 1;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < (int)uVar3) {
    uVar2 = uVar3 & 0xffffffff;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    this[uVar3 + 1].header = this[uVar3 + 2].header;
  }
  pop(this);
  calcAbstraction(this);
  return;
}

Assistant:

inline void Clause::strengthen(Lit p)
{
    remove(*this, p);
    calcAbstraction();
}